

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

bool google::protobuf::compiler::ruby::UsesTypeFromFile
               (Descriptor *message,FileDescriptor *file,string *error)

{
  FieldDescriptor *this;
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  Descriptor *pDVar4;
  EnumDescriptor *pEVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar8 = 0;
  lVar7 = 0;
  while( true ) {
    if (*(int *)(message + 0x68) <= lVar7) {
      lVar7 = -1;
      lVar8 = 0;
      do {
        lVar6 = (long)*(int *)(message + 0x70);
        lVar7 = lVar7 + 1;
        if (lVar6 <= lVar7) {
          return lVar7 < lVar6;
        }
        bVar1 = UsesTypeFromFile((Descriptor *)(lVar8 + *(long *)(message + 0x38)),file,error);
        lVar8 = lVar8 + 0x90;
      } while (!bVar1);
      return lVar7 < lVar6;
    }
    lVar6 = *(long *)(message + 0x28);
    this = (FieldDescriptor *)(lVar6 + lVar8);
    CVar2 = FieldDescriptor::cpp_type(this);
    if (((CVar2 == CPPTYPE_MESSAGE) &&
        (pDVar4 = FieldDescriptor::message_type(this), *(FileDescriptor **)(pDVar4 + 0x10) == file))
       || ((TVar3 = FieldDescriptor::type(this), TVar3 == TYPE_ENUM &&
           (pEVar5 = FieldDescriptor::enum_type(this), *(FileDescriptor **)(pEVar5 + 0x10) == file))
          )) break;
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + 0x98;
  }
  std::operator+(&local_70,"proto3 message field ",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar6 + 8 + lVar8));
  std::operator+(&local_f0,&local_70," in file ");
  std::operator+(&local_d0,&local_f0,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file);
  std::operator+(&local_b0,&local_d0," has a dependency on a type from proto2 file ");
  std::operator+(&local_90,&local_b0,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file);
  std::operator+(&local_50,&local_90,".  Ruby doesn\'t support proto2 yet, so we must fail.");
  std::__cxx11::string::operator=((string *)error,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_70);
  return true;
}

Assistant:

bool UsesTypeFromFile(const Descriptor* message, const FileDescriptor* file,
                      string* error) {
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if ((field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
         field->message_type()->file() == file) ||
        (field->type() == FieldDescriptor::TYPE_ENUM &&
         field->enum_type()->file() == file)) {
      *error = "proto3 message field " + field->full_name() + " in file " +
               file->name() + " has a dependency on a type from proto2 file " +
               file->name() +
               ".  Ruby doesn't support proto2 yet, so we must fail.";
      return true;
    }
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    if (UsesTypeFromFile(message->nested_type(i), file, error)) {
      return true;
    }
  }

  return false;
}